

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint.h
# Opt level: O0

void __thiscall mp::SafeInt<int>::SafeInt<unsigned_long>(SafeInt<int> *this,unsigned_long value)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  void *__s;
  OverflowError *this_00;
  ulong in_RSI;
  undefined4 *in_RDI;
  Type_conflict max;
  Type unsigned_value;
  LongLong min;
  LongLong signed_value;
  OverflowError *in_stack_ffffffffffffffc0;
  
  *in_RDI = (int)in_RSI;
  bVar1 = fmt::internal::is_negative<unsigned_long>(0x283bd4);
  if (bVar1) {
    iVar2 = std::numeric_limits<int>::min();
    if ((long)in_RSI < (long)iVar2) {
      __s = (void *)__cxa_allocate_exception(8);
      memset(__s,0,8);
      OverflowError::OverflowError(in_stack_ffffffffffffffc0);
      __cxa_throw(__s,&OverflowError::typeinfo,OverflowError::~OverflowError);
    }
  }
  else {
    uVar3 = std::numeric_limits<int>::max();
    if (uVar3 < in_RSI) {
      this_00 = (OverflowError *)__cxa_allocate_exception(8);
      memset(this_00,0,8);
      OverflowError::OverflowError(this_00);
      __cxa_throw(this_00,&OverflowError::typeinfo,OverflowError::~OverflowError);
    }
  }
  return;
}

Assistant:

explicit SafeInt(U value) : value_(static_cast<T>(value)) {
    if (fmt::internal::is_negative(value)) {
      fmt::LongLong signed_value = value, min = std::numeric_limits<T>::min();
      if (signed_value < min)
        throw OverflowError();
    } else {
      typename MakeUnsigned<U>::Type unsigned_value = value;
      typename MakeUnsigned<T>::Type max = std::numeric_limits<T>::max();
      if (unsigned_value > max)
        throw OverflowError();
    }
  }